

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::HttpInputStream::Response> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Response>::operator=
          (ExceptionOr<kj::HttpInputStream::Response> *this,
          ExceptionOr<kj::HttpInputStream::Response> *param_1)

{
  ExceptionOr<kj::HttpInputStream::Response> *param_1_local;
  ExceptionOr<kj::HttpInputStream::Response> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::HttpInputStream::Response>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;